

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insertCodePoint
          (NumberStringBuilder *this,int32_t index,UChar32 codePoint,Field field,UErrorCode *status)

{
  int32_t iVar1;
  long lVar2;
  Field *pFVar3;
  ValueOrHeapArray<char16_t> *pVVar4;
  ValueOrHeapArray<UNumberFormatFields> *pVVar5;
  int count;
  bool bVar6;
  
  count = 2 - (uint)((uint)codePoint < 0x10000);
  iVar1 = prepareForInsert(this,index,count,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((uint)codePoint < 0x10000) {
      bVar6 = this->fUsingHeap != false;
      pVVar4 = &this->fChars;
      if (bVar6) {
        pVVar4 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      }
      pVVar4->value[iVar1] = (char16_t)codePoint;
      pVVar5 = &this->fFields;
      if (bVar6) {
        pVVar5 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      }
      pFVar3 = pVVar5->value + iVar1;
    }
    else {
      bVar6 = this->fUsingHeap != false;
      pVVar4 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      if (!bVar6) {
        pVVar4 = &this->fChars;
      }
      lVar2 = (long)iVar1;
      pVVar4->value[lVar2] = (short)((uint)codePoint >> 10) + L'ퟀ';
      pVVar4 = &this->fChars;
      if (bVar6) {
        pVVar4 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      }
      *(char16_t *)((long)pVVar4 + lVar2 * 2 + 2) = (char16_t)codePoint & 0x3ffU | 0xdc00;
      pVVar5 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      if (!bVar6) {
        pVVar5 = &this->fFields;
      }
      *(Field *)((long)pVVar5 + lVar2 * 4 + 4) = field;
      pVVar5 = &this->fFields;
      if (bVar6) {
        pVVar5 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      }
      pFVar3 = pVVar5->value + lVar2;
    }
    *pFVar3 = field;
  }
  return count;
}

Assistant:

int32_t
NumberStringBuilder::insertCodePoint(int32_t index, UChar32 codePoint, Field field, UErrorCode &status) {
    int32_t count = U16_LENGTH(codePoint);
    int32_t position = prepareForInsert(index, count, status);
    if (U_FAILURE(status)) {
        return count;
    }
    if (count == 1) {
        getCharPtr()[position] = (char16_t) codePoint;
        getFieldPtr()[position] = field;
    } else {
        getCharPtr()[position] = U16_LEAD(codePoint);
        getCharPtr()[position + 1] = U16_TRAIL(codePoint);
        getFieldPtr()[position] = getFieldPtr()[position + 1] = field;
    }
    return count;
}